

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_ClausProcessClauses(Clu_Man_t *p,int fRefs)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Fra_Sml_t *pSeq;
  Aig_Man_t *pAVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  Clu_Man_t *pCVar12;
  Aig_MmFixed_t *pAVar13;
  Dar_Cut_t *pDVar14;
  uint uVar15;
  void *pvVar16;
  timespec ts_7;
  int Scores [16];
  timespec local_b0;
  Fra_Sml_t *local_a0;
  timespec local_98 [4];
  long local_50;
  Aig_MmFixed_t *local_48;
  long local_40;
  void *local_38;
  
  iVar2 = clock_gettime(3,local_98);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98[0].tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_98[0].tv_sec * -1000000;
  }
  Aig_ManRandom(1);
  pAVar4 = p->pAig;
  pSeq = Fra_SmlSimulateSeq(pAVar4,0,p->nPref + p->nSimFrames,p->nSimWords / p->nSimFrames,1);
  if ((p->fTarget == 0) || (pSeq->fNonConstOut == 0)) {
    if (p->fVerbose != 0) {
      Abc_Print((int)pAVar4,"%s =","Sim-seq");
      iVar11 = 3;
      iVar2 = clock_gettime(3,local_98);
      if (iVar2 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_98[0].tv_nsec / 1000 + local_98[0].tv_sec * 1000000;
      }
      Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
    }
    iVar2 = clock_gettime(3,local_98);
    if (iVar2 < 0) {
      lVar8 = 1;
    }
    else {
      lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98[0].tv_nsec),8);
      lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_98[0].tv_sec * -1000000;
    }
    if ((fRefs != 0) && (pCVar12 = p, Fra_ClausCollectLatchClauses(p,pSeq), p->fVerbose != 0)) {
      Abc_Print((int)pCVar12,"%s =","Lat-cla");
      iVar11 = 3;
      iVar2 = clock_gettime(3,local_98);
      if (iVar2 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_98[0].tv_nsec / 1000 + local_98[0].tv_sec * 1000000;
      }
      Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
    }
    iVar2 = clock_gettime(3,local_98);
    if (iVar2 < 0) {
      lVar8 = 1;
    }
    else {
      lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98[0].tv_nsec),8);
      lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_98[0].tv_sec * -1000000;
    }
    pAVar4 = p->pAig;
    local_48 = Dar_ManComputeCuts(pAVar4,10,0,1);
    if (p->fVerbose != 0) {
      Abc_Print((int)pAVar4,"%s =","Cuts   ");
      iVar11 = 3;
      iVar2 = clock_gettime(3,local_98);
      if (iVar2 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_98[0].tv_nsec / 1000 + local_98[0].tv_sec * 1000000;
      }
      Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
    }
    pCVar12 = (Clu_Man_t *)0x3;
    iVar2 = clock_gettime(3,local_98);
    iVar11 = (int)pCVar12;
    if (iVar2 < 0) {
      local_a0 = (Fra_Sml_t *)0x1;
    }
    else {
      lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98[0].tv_nsec),8);
      local_a0 = (Fra_Sml_t *)(((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_98[0].tv_sec * -1000000);
    }
    pAVar4 = p->pAig;
    pVVar6 = pAVar4->vObjs;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        pvVar16 = pVVar6->pArray[lVar8];
        if ((pvVar16 != (void *)0x0) &&
           (uVar5 = *(ulong *)((long)pvVar16 + 0x18),
           0xffffffffffffff < uVar5 && 0xfffffffd < ((uint)uVar5 & 7) - 7)) {
          pDVar14 = *(Dar_Cut_t **)((long)pvVar16 + 0x28);
          uVar15 = 0;
          do {
            if (0x3fffffff < *(uint *)&pDVar14->field_0x4 &&
                (*(uint *)&pDVar14->field_0x4 >> 0x1c & 1) != 0) {
              pCVar12 = p;
              iVar2 = Fra_ClausProcessClausesCut(p,pSeq,pDVar14,(int *)local_98);
              *(short *)&pDVar14->field_0x4 = (short)iVar2;
              uVar5 = *(ulong *)((long)pvVar16 + 0x18);
            }
            uVar15 = uVar15 + 1;
            pDVar14 = pDVar14 + 1;
          } while (uVar15 < (byte)(uVar5 >> 0x38));
          pAVar4 = p->pAig;
        }
        iVar11 = (int)pCVar12;
        lVar8 = lVar8 + 1;
        pVVar6 = pAVar4->vObjs;
      } while (lVar8 < pVVar6->nSize);
    }
    if (p->fVerbose != 0) {
      Abc_Print(iVar11,"%s =","Infoseq");
      iVar11 = 3;
      iVar2 = clock_gettime(3,&local_b0);
      if (iVar2 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_b0.tv_nsec / 1000 + local_b0.tv_sec * 1000000;
      }
      Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar8 + (long)local_a0) / 1000000.0);
    }
    Fra_SmlStop(pSeq);
    iVar2 = clock_gettime(3,&local_b0);
    if (iVar2 < 0) {
      lVar8 = 1;
    }
    else {
      lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b0.tv_nsec),8);
      lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_b0.tv_sec * -1000000;
    }
    Aig_ManRandom(1);
    pAVar4 = p->pAig;
    local_a0 = Fra_SmlSimulateComb(pAVar4,p->nSimWordsPref + p->nSimWords,0);
    if (p->fVerbose != 0) {
      Abc_Print((int)pAVar4,"%s =","Sim-cmb");
      iVar11 = 3;
      iVar2 = clock_gettime(3,&local_b0);
      if (iVar2 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_b0.tv_nsec / 1000 + local_b0.tv_sec * 1000000;
      }
      Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
    }
    iVar2 = clock_gettime(3,&local_b0);
    if (iVar2 < 0) {
      local_50 = 1;
    }
    else {
      lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b0.tv_nsec),8);
      local_50 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_b0.tv_sec * -1000000;
    }
    pAVar4 = p->pAig;
    pVVar6 = pAVar4->vObjs;
    if (pVVar6->nSize < 1) {
      uVar15 = 0;
    }
    else {
      lVar8 = 0;
      uVar15 = 0;
      do {
        pvVar16 = pVVar6->pArray[lVar8];
        if ((pvVar16 != (void *)0x0) &&
           (0xffffffffffffff < *(ulong *)((long)pvVar16 + 0x18) &&
            0xfffffffd < ((uint)*(ulong *)((long)pvVar16 + 0x18) & 7) - 7)) {
          pDVar14 = *(Dar_Cut_t **)((long)pvVar16 + 0x28);
          uVar10 = 0;
          local_40 = lVar8;
          local_38 = pvVar16;
          do {
            if (0x3fffffff < *(uint *)&pDVar14->field_0x4 &&
                (*(uint *)&pDVar14->field_0x4 >> 0x1c & 1) != 0) {
              uVar15 = uVar15 + 1;
              uVar3 = Fra_ClausProcessClausesCut(p,local_a0,pDVar14,(int *)local_98);
              uVar1 = *(uint *)&pDVar14->field_0x4;
              uVar7 = uVar1 & 0xffff0000;
              *(uint *)&pDVar14->field_0x4 = uVar7;
              uVar3 = (~uVar1 | 0xffff0000) & uVar3;
              if (uVar3 != 0) {
                lVar8 = 0;
                do {
                  if ((uVar3 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
                    Fra_ClausRecordClause
                              (p,pDVar14,(uint)lVar8,*(int *)((long)&local_98[0].tv_sec + lVar8 * 4)
                              );
                    uVar7 = *(uint *)&pDVar14->field_0x4;
                  }
                  lVar8 = lVar8 + 1;
                  pvVar16 = local_38;
                } while ((uint)lVar8 >> (byte)(uVar7 >> 0x1d) == 0);
              }
            }
            uVar10 = uVar10 + 1;
            pDVar14 = pDVar14 + 1;
          } while (uVar10 < *(byte *)((long)pvVar16 + 0x1f));
          pAVar4 = p->pAig;
          lVar8 = local_40;
        }
        lVar8 = lVar8 + 1;
        pVVar6 = pAVar4->vObjs;
      } while (lVar8 < pVVar6->nSize);
    }
    Fra_SmlStop(local_a0);
    pAVar13 = local_48;
    Aig_MmFixedStop(local_48,0);
    if (p->fVerbose != 0) {
      Abc_Print((int)pAVar13,"%s =","Infocmb");
      iVar11 = 3;
      iVar2 = clock_gettime(3,&local_b0);
      if (iVar2 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_b0.tv_nsec / 1000 + local_b0.tv_sec * 1000000;
      }
      Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar8 + local_50) / 1000000.0);
      if (p->fVerbose != 0) {
        printf("Node = %5d. Non-triv cuts = %7d. Clauses = %6d. Clause per cut = %6.2f.\n",
               (double)p->vClauses->nSize / (double)(int)uVar15,
               (ulong)(uint)(p->pAig->nObjs[6] + p->pAig->nObjs[5]),(ulong)uVar15);
      }
    }
    iVar2 = p->vClauses->nSize;
    if (p->nClausesMax < iVar2) {
      Fra_ClausSelectClauses(p);
    }
    else {
      p->nClauses = iVar2;
    }
    iVar2 = 1;
  }
  else {
    puts("Property failed after sequential simulation!");
    Fra_SmlStop(pSeq);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Fra_ClausProcessClauses( Clu_Man_t * p, int fRefs )
{
    Aig_MmFixed_t * pMemCuts;
//    Aig_ManCut_t * pManCut;
    Fra_Sml_t * pComb, * pSeq;
    Aig_Obj_t * pObj;
    Dar_Cut_t * pCut;
    int Scores[16], uScores, i, k, j, nCuts = 0;
    abctime clk;

    // simulate the AIG
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pSeq = Fra_SmlSimulateSeq( p->pAig, 0, p->nPref + p->nSimFrames, p->nSimWords/p->nSimFrames, 1 );
    if ( p->fTarget && pSeq->fNonConstOut )
    {
        printf( "Property failed after sequential simulation!\n" );
        Fra_SmlStop( pSeq );
        return 0;
    }
if ( p->fVerbose )
{
ABC_PRT( "Sim-seq", Abc_Clock() - clk );
}


clk = Abc_Clock();
    if ( fRefs )
    {
    Fra_ClausCollectLatchClauses( p, pSeq );
if ( p->fVerbose )
{
ABC_PRT( "Lat-cla", Abc_Clock() - clk );
}
    }


    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
    pMemCuts = Dar_ManComputeCuts( p->pAig, 10, 0, 1 );
//    pManCut = Aig_ComputeCuts( p->pAig, 10, 4, 0, 1 );
if ( p->fVerbose )
{
ABC_PRT( "Cuts   ", Abc_Clock() - clk );
}

    // collect sequential info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves > 1 )
            {
                pCut->uTruth = Fra_ClausProcessClausesCut( p, pSeq, pCut, Scores );
//                uScores = Fra_ClausProcessClausesCut2( p, pSeq, pCut, Scores );
//                if ( uScores != pCut->uTruth )
//                {
//                    int x = 0;
//                }
            }
if ( p->fVerbose )
{
ABC_PRT( "Infoseq", Abc_Clock() - clk );
}
    Fra_SmlStop( pSeq );

    // perform combinational simulation
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pComb = Fra_SmlSimulateComb( p->pAig, p->nSimWords + p->nSimWordsPref, 0 );
if ( p->fVerbose )
{
ABC_PRT( "Sim-cmb", Abc_Clock() - clk );
}

    // collect combinational info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves > 1 )
            {
                nCuts++;
                uScores = Fra_ClausProcessClausesCut( p, pComb, pCut, Scores );
                uScores &= ~pCut->uTruth; pCut->uTruth = 0;
                if ( uScores == 0 )
                    continue;
                // write the clauses
                for ( j = 0; j < (1<<pCut->nLeaves); j++ )
                    if ( uScores & (1 << j) )
                        Fra_ClausRecordClause( p, pCut, j, Scores[j] );

            }
    Fra_SmlStop( pComb );
    Aig_MmFixedStop( pMemCuts, 0 );
//    Aig_ManCutStop( pManCut );
if ( p->fVerbose )
{
ABC_PRT( "Infocmb", Abc_Clock() - clk );
}

    if ( p->fVerbose )
    printf( "Node = %5d. Non-triv cuts = %7d. Clauses = %6d. Clause per cut = %6.2f.\n", 
        Aig_ManNodeNum(p->pAig), nCuts, Vec_IntSize(p->vClauses), 1.0*Vec_IntSize(p->vClauses)/nCuts );

    if ( Vec_IntSize(p->vClauses) > p->nClausesMax )
        Fra_ClausSelectClauses( p );
    else
        p->nClauses = Vec_IntSize( p->vClauses );
    return 1;
}